

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

bool __thiscall TgBot::Api::unpinChatMessage(Api *this,int64_t chatId)

{
  type_conflict tVar1;
  bool local_c2 [2];
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  allocator local_89;
  string local_88;
  ptree local_68;
  undefined1 local_30 [8];
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  int64_t chatId_local;
  Api *this_local;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)chatId;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_30);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_30,1);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],long&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)local_30,
             (char (*) [8])0x4758d6,
             (long *)&args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"unpinChatMessage",&local_89);
  sendRequest(&local_68,this,&local_88,
              (vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_30);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_c0,"",0x2e);
  local_c2[0] = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_68,&local_c0,local_c2);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~string_path(&local_c0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector
            ((vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> *)local_30);
  return tVar1;
}

Assistant:

bool Api::unpinChatMessage(int64_t chatId) const {
    vector<HttpReqArg> args;
    args.reserve(1);
    args.emplace_back("chat_id", chatId);
    return sendRequest("unpinChatMessage", args).get<bool>("", false);
}